

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightVectorPhrase.hpp
# Opt level: O2

string * __thiscall
wv::WeightVectorPhrase::getConcreteCoord_abi_cxx11_
          (string *__return_storage_ptr__,WeightVectorPhrase *this,uint32_t number)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)((this->m_Coords).m_MasPoint + number));
  return __return_storage_ptr__;
}

Assistant:

std::string getConcreteCoord(uint32_t number) const
        {
            return m_Coords[number]; //m_Coords.at(number); 
        }